

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O2

void __thiscall Sexp::Finalize(Sexp *this)

{
  Sexp *this_00;
  
  switch(this->kind) {
  case STRING:
    free((this->field_1).cons.car);
    return;
  default:
    PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
              ,0x3c,"Finalize","finalized something that\'s not finalizable!");
  case ACTIVATION:
    this_00 = (Sexp *)(this->field_1).activation;
    if (this_00 != (Sexp *)0x0) {
      std::_Vector_base<Sexp_*,_std::allocator<Sexp_*>_>::~_Vector_base
                ((_Vector_base<Sexp_*,_std::allocator<Sexp_*>_> *)&(this_00->field_1).cons);
    }
    break;
  case FUNCTION:
  case MEANING:
    return;
  case NATIVE_FUNCTION:
    this_00 = (this->field_1).cons.car;
    if (this_00 != (Sexp *)0x0) {
      std::_Function_base::~_Function_base((_Function_base *)this_00);
    }
  }
  operator_delete(this_00,0x20);
  return;
}

Assistant:

void Sexp::Finalize() {
  if (IsString()) {
    free(const_cast<char *>(this->string_value));
    return;
  }

  if (IsActivation()) {
    delete this->activation;
    return;
  }

  if (IsNativeFunction()) {
    delete this->native_function.func;
    return;
  }

  if (IsFunction()) {
    // TODO this also screws up everything.
    // delete this->function.func_meaning;
    return;
  }

  if (IsMeaning()) {
    // TODO this screws up everything.
    // I'm choosing to leak meanings for now
    // until I figure out how to address this correctly.
    // delete this->meaning;

    return;
  }

  PANIC("finalized something that's not finalizable!");
}